

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QMakeParser::BlockScope>::copyAppend
          (QGenericArrayOps<QMakeParser::BlockScope> *this,BlockScope *b,BlockScope *e)

{
  undefined8 uVar1;
  BlockScope *pBVar2;
  BlockScope *pBVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  BlockScope *data;
  undefined8 *local_10;
  
  if (in_RSI != in_RDX) {
    pBVar2 = QArrayDataPointer<QMakeParser::BlockScope>::begin
                       ((QArrayDataPointer<QMakeParser::BlockScope> *)0x318d47);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pBVar3 = pBVar2 + *(long *)(in_RDI + 0x10);
      pBVar3->start = (ushort *)*local_10;
      uVar1 = local_10[1];
      pBVar3->braceLevel = (int)uVar1;
      pBVar3->special = (bool)(char)((ulong)uVar1 >> 0x20);
      pBVar3->inBranch = (bool)(char)((ulong)uVar1 >> 0x28);
      pBVar3->nest = (char)((ulong)uVar1 >> 0x30);
      pBVar3->field_0xf = (char)((ulong)uVar1 >> 0x38);
      local_10 = local_10 + 2;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }